

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word_analyze.cpp
# Opt level: O1

void front::word::word_analyse
               (string *input_str,
               vector<front::word::Word,_std::allocator<front::word::Word>_> *word_arr)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  Token in_token_value;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  undefined8 uVar8;
  _Alloc_hider _Var9;
  byte bVar10;
  char cVar11;
  bool bVar12;
  string buf;
  undefined1 local_3c8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b0;
  vector<front::word::Word,_std::allocator<front::word::Word>_> *local_398;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
  local_390._M_string_length = 0;
  local_390.field_2._M_local_buf[0] = '\0';
  local_398 = word_arr;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c8,'\0'
                 ,input_str);
  std::__cxx11::string::operator=((string *)input_str,(string *)local_3c8);
  if ((undefined1 *)local_3c8._0_8_ != local_3c8 + 0x10) {
    operator_delete((void *)local_3c8._0_8_,local_3c8._16_8_ + 1);
  }
  uVar7 = 0;
  bVar10 = 0;
  do {
    if (input_str->_M_string_length <= uVar7) break;
    uVar1 = uVar7 + 1;
    if ((uVar1 < input_str->_M_string_length) &&
       (bVar10 = (input_str->_M_dataplus)._M_p[uVar1], uVar7 = uVar1, bVar10 == 10)) {
      line_num = line_num + 1;
    }
    local_390._M_string_length = 0;
    *local_390._M_dataplus._M_p = '\0';
    uVar1 = input_str->_M_string_length;
    uVar5 = uVar7 + 1;
    if (uVar7 + 1 < uVar1) {
      uVar5 = uVar1;
    }
    uVar6 = uVar7;
    uVar3 = line_num;
    while (((0x5d < (byte)(bVar10 - 0x21) ||
            (((bVar10 - 0x40 < 0x3f &&
              ((0x4000000140000001U >> ((ulong)(bVar10 - 0x40) & 0x3f) & 1) != 0)) ||
             (uVar7 = uVar6, bVar10 - 0x23 < 2)))) &&
           (uVar2 = uVar6 + 1, uVar7 = uVar5 - 1, uVar2 < uVar1))) {
      bVar10 = (input_str->_M_dataplus)._M_p[uVar6 + 1];
      uVar6 = uVar2;
      if (bVar10 == 10) {
        uVar3 = uVar3 + 1;
        line_num = uVar3;
      }
    }
    iVar4 = isalpha((int)(char)bVar10);
    if ((bVar10 == 0x5f) || (iVar4 != 0)) {
      do {
        std::__cxx11::string::push_back((char)&local_390);
        uVar1 = uVar7 + 1;
        if ((uVar1 < input_str->_M_string_length) &&
           (bVar10 = (input_str->_M_dataplus)._M_p[uVar1], uVar7 = uVar1, bVar10 == 10)) {
          line_num = line_num + 1;
        }
        iVar4 = isalpha((int)(char)bVar10);
      } while ((int)(char)bVar10 - 0x30U < 10 || (bVar10 == 0x5f || iVar4 != 0));
      if (bVar10 == 10) {
        line_num = line_num - 1;
      }
      bVar10 = (input_str->_M_dataplus)._M_p[uVar7 - 1];
      in_token_value = get_token(&local_390);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,local_390._M_dataplus._M_p,
                 local_390._M_dataplus._M_p + local_390._M_string_length);
      Word::Word((Word *)local_3c8,in_token_value,&local_50,line_num);
      std::vector<front::word::Word,_std::allocator<front::word::Word>_>::
      emplace_back<front::word::Word>(local_398,(Word *)local_3c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c8._8_8_ != &local_3b0) {
        operator_delete((void *)local_3c8._8_8_,local_3b0._0_8_ + 1);
      }
      uVar8 = local_50.field_2._M_allocated_capacity;
      _Var9._M_p = local_50._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
LAB_001b004f:
        operator_delete(_Var9._M_p,uVar8 + 1);
      }
      goto LAB_001b0057;
    }
    if ((int)(char)bVar10 - 0x30U < 10) {
      if (bVar10 == 0x30) {
        toupper(0x30);
        std::__cxx11::string::push_back((char)&local_390);
        uVar1 = uVar7 + 1;
        if ((uVar1 < input_str->_M_string_length) &&
           (bVar10 = (input_str->_M_dataplus)._M_p[uVar1], uVar7 = uVar1, bVar10 == 10)) {
          line_num = line_num + 1;
        }
        if ((bVar10 & 0xdf) == 0x58) {
          toupper((uint)bVar10);
          std::__cxx11::string::push_back((char)&local_390);
          uVar1 = uVar7 + 1;
          if ((uVar1 < input_str->_M_string_length) &&
             (bVar10 = (input_str->_M_dataplus)._M_p[uVar1], uVar7 = uVar1, bVar10 == 10)) {
            line_num = line_num + 1;
          }
          do {
            toupper((int)(char)bVar10);
            std::__cxx11::string::push_back((char)&local_390);
            uVar1 = uVar7 + 1;
            if ((uVar1 < input_str->_M_string_length) &&
               (bVar10 = (input_str->_M_dataplus)._M_p[uVar1], uVar7 = uVar1, bVar10 == 10)) {
              line_num = line_num + 1;
            }
            uVar3 = tolower((int)(char)bVar10);
          } while (uVar3 << 0x18 == 0x66000000 ||
                   (((uVar3 & 0xfe) == 100 || (int)(char)bVar10 - 0x30U < 10) ||
                   ((uVar3 & 0xfd) == 0x61 || uVar3 << 0x18 == 0x62000000)));
        }
        else if ((bVar10 & 0xf8) == 0x30) {
          do {
            std::__cxx11::string::push_back((char)&local_390);
            uVar1 = uVar7 + 1;
            if ((uVar1 < input_str->_M_string_length) &&
               (bVar10 = (input_str->_M_dataplus)._M_p[uVar1], uVar7 = uVar1, bVar10 == 10)) {
              line_num = line_num + 1;
            }
          } while ((int)(char)bVar10 - 0x30U < 10);
        }
      }
      else {
        do {
          std::__cxx11::string::push_back((char)&local_390);
          uVar1 = uVar7 + 1;
          if ((uVar1 < input_str->_M_string_length) &&
             (bVar10 = (input_str->_M_dataplus)._M_p[uVar1], uVar7 = uVar1, bVar10 == 10)) {
            line_num = line_num + 1;
          }
        } while ((int)(char)bVar10 - 0x30U < 10);
      }
      if (bVar10 == 10) {
        line_num = line_num - 1;
      }
      bVar10 = (input_str->_M_dataplus)._M_p[uVar7 - 1];
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,local_390._M_dataplus._M_p,
                 local_390._M_dataplus._M_p + local_390._M_string_length);
      Word::Word((Word *)local_3c8,INTCON,&local_70,line_num);
      std::vector<front::word::Word,_std::allocator<front::word::Word>_>::
      emplace_back<front::word::Word>(local_398,(Word *)local_3c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c8._8_8_ != &local_3b0) {
        operator_delete((void *)local_3c8._8_8_,local_3b0._0_8_ + 1);
      }
      uVar8 = local_70.field_2._M_allocated_capacity;
      _Var9._M_p = local_70._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) goto LAB_001b004f;
      goto LAB_001b0057;
    }
    if (0x5a < bVar10) {
      if (bVar10 < 0x7b) {
        if (bVar10 == 0x5b) {
          std::__cxx11::string::push_back((char)&local_390);
          local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_310,local_390._M_dataplus._M_p,
                     local_390._M_dataplus._M_p + local_390._M_string_length);
          Word::Word((Word *)local_3c8,LBRACK,&local_310,line_num);
          std::vector<front::word::Word,_std::allocator<front::word::Word>_>::
          emplace_back<front::word::Word>(local_398,(Word *)local_3c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3c8._8_8_ != &local_3b0) {
            operator_delete((void *)local_3c8._8_8_,local_3b0._0_8_ + 1);
          }
          uVar8 = local_310.field_2._M_allocated_capacity;
          _Var9._M_p = local_310._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_310._M_dataplus._M_p != &local_310.field_2) goto LAB_001b0cd7;
        }
        else if (bVar10 == 0x5d) {
          std::__cxx11::string::push_back((char)&local_390);
          local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_330,local_390._M_dataplus._M_p,
                     local_390._M_dataplus._M_p + local_390._M_string_length);
          Word::Word((Word *)local_3c8,RBRACK,&local_330,line_num);
          std::vector<front::word::Word,_std::allocator<front::word::Word>_>::
          emplace_back<front::word::Word>(local_398,(Word *)local_3c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3c8._8_8_ != &local_3b0) {
            operator_delete((void *)local_3c8._8_8_,local_3b0._0_8_ + 1);
          }
          uVar8 = local_330.field_2._M_allocated_capacity;
          _Var9._M_p = local_330._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_330._M_dataplus._M_p != &local_330.field_2) goto LAB_001b0cd7;
        }
      }
      else if (bVar10 == 0x7b) {
        std::__cxx11::string::push_back((char)&local_390);
        local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_350,local_390._M_dataplus._M_p,
                   local_390._M_dataplus._M_p + local_390._M_string_length);
        Word::Word((Word *)local_3c8,LBRACE,&local_350,line_num);
        std::vector<front::word::Word,_std::allocator<front::word::Word>_>::
        emplace_back<front::word::Word>(local_398,(Word *)local_3c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3c8._8_8_ != &local_3b0) {
          operator_delete((void *)local_3c8._8_8_,local_3b0._0_8_ + 1);
        }
        uVar8 = local_350.field_2._M_allocated_capacity;
        _Var9._M_p = local_350._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_350._M_dataplus._M_p != &local_350.field_2) goto LAB_001b0cd7;
      }
      else if (bVar10 == 0x7c) {
        std::__cxx11::string::push_back((char)&local_390);
        uVar1 = uVar7 + 1;
        if ((uVar1 < input_str->_M_string_length) &&
           (bVar10 = (input_str->_M_dataplus)._M_p[uVar1], uVar7 = uVar1, bVar10 == 10)) {
          line_num = line_num + 1;
        }
        std::__cxx11::string::push_back((char)&local_390);
        local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_270,local_390._M_dataplus._M_p,
                   local_390._M_dataplus._M_p + local_390._M_string_length);
        Word::Word((Word *)local_3c8,OR,&local_270,line_num);
        std::vector<front::word::Word,_std::allocator<front::word::Word>_>::
        emplace_back<front::word::Word>(local_398,(Word *)local_3c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3c8._8_8_ != &local_3b0) {
          operator_delete((void *)local_3c8._8_8_,local_3b0._0_8_ + 1);
        }
        uVar8 = local_270.field_2._M_allocated_capacity;
        _Var9._M_p = local_270._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_270._M_dataplus._M_p != &local_270.field_2) goto LAB_001b0cd7;
      }
      else if (bVar10 == 0x7d) {
        std::__cxx11::string::push_back((char)&local_390);
        local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_370,local_390._M_dataplus._M_p,
                   local_390._M_dataplus._M_p + local_390._M_string_length);
        Word::Word((Word *)local_3c8,RBRACE,&local_370,line_num);
        std::vector<front::word::Word,_std::allocator<front::word::Word>_>::
        emplace_back<front::word::Word>(local_398,(Word *)local_3c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3c8._8_8_ != &local_3b0) {
          operator_delete((void *)local_3c8._8_8_,local_3b0._0_8_ + 1);
        }
        uVar8 = local_370.field_2._M_allocated_capacity;
        _Var9._M_p = local_370._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_370._M_dataplus._M_p != &local_370.field_2) goto LAB_001b0cd7;
      }
      goto switchD_001afd99_caseD_23;
    }
    switch(bVar10) {
    case 0x21:
      std::__cxx11::string::push_back((char)&local_390);
      uVar1 = uVar7 + 1;
      if ((uVar1 < input_str->_M_string_length) &&
         (bVar10 = (input_str->_M_dataplus)._M_p[uVar1], uVar7 = uVar1, bVar10 == 10)) {
        line_num = line_num + 1;
      }
      if (bVar10 == 10) {
        line_num = line_num - 1;
      }
      else if (bVar10 == 0x3d) {
        std::__cxx11::string::push_back((char)&local_390);
        local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_210,local_390._M_dataplus._M_p,
                   local_390._M_dataplus._M_p + local_390._M_string_length);
        Word::Word((Word *)local_3c8,NEQ,&local_210,line_num);
        std::vector<front::word::Word,_std::allocator<front::word::Word>_>::
        emplace_back<front::word::Word>(local_398,(Word *)local_3c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3c8._8_8_ != &local_3b0) {
          operator_delete((void *)local_3c8._8_8_,local_3b0._0_8_ + 1);
        }
        uVar8 = local_210.field_2._M_allocated_capacity;
        _Var9._M_p = local_210._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != &local_210.field_2) goto LAB_001b0cd7;
        break;
      }
      bVar10 = (input_str->_M_dataplus)._M_p[uVar7 - 1];
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_230,local_390._M_dataplus._M_p,
                 local_390._M_dataplus._M_p + local_390._M_string_length);
      Word::Word((Word *)local_3c8,NOT,&local_230,line_num);
      std::vector<front::word::Word,_std::allocator<front::word::Word>_>::
      emplace_back<front::word::Word>(local_398,(Word *)local_3c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c8._8_8_ != &local_3b0) {
        operator_delete((void *)local_3c8._8_8_,local_3b0._0_8_ + 1);
      }
      uVar8 = local_230.field_2._M_allocated_capacity;
      _Var9._M_p = local_230._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) goto LAB_001b004f;
      goto LAB_001b0057;
    case 0x22:
      while( true ) {
        uVar1 = uVar7 + 1;
        if ((uVar1 < input_str->_M_string_length) &&
           (bVar10 = (input_str->_M_dataplus)._M_p[uVar1], uVar7 = uVar1, bVar10 == 10)) {
          line_num = line_num + 1;
        }
        if (bVar10 == 0x22) break;
        std::__cxx11::string::push_back((char)&local_390);
      }
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,local_390._M_dataplus._M_p,
                 local_390._M_dataplus._M_p + local_390._M_string_length);
      Word::Word((Word *)local_3c8,STRCON,&local_90,line_num);
      std::vector<front::word::Word,_std::allocator<front::word::Word>_>::
      emplace_back<front::word::Word>(local_398,(Word *)local_3c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c8._8_8_ != &local_3b0) {
        operator_delete((void *)local_3c8._8_8_,local_3b0._0_8_ + 1);
      }
      uVar8 = local_90.field_2._M_allocated_capacity;
      _Var9._M_p = local_90._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
LAB_001b0cd7:
        operator_delete(_Var9._M_p,uVar8 + 1);
      }
      break;
    case 0x25:
      std::__cxx11::string::push_back((char)&local_390);
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_130,local_390._M_dataplus._M_p,
                 local_390._M_dataplus._M_p + local_390._M_string_length);
      Word::Word((Word *)local_3c8,MOD,&local_130,line_num);
      std::vector<front::word::Word,_std::allocator<front::word::Word>_>::
      emplace_back<front::word::Word>(local_398,(Word *)local_3c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c8._8_8_ != &local_3b0) {
        operator_delete((void *)local_3c8._8_8_,local_3b0._0_8_ + 1);
      }
      uVar8 = local_130.field_2._M_allocated_capacity;
      _Var9._M_p = local_130._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) goto LAB_001b0cd7;
      break;
    case 0x26:
      std::__cxx11::string::push_back((char)&local_390);
      uVar1 = uVar7 + 1;
      if ((uVar1 < input_str->_M_string_length) &&
         (bVar10 = (input_str->_M_dataplus)._M_p[uVar1], uVar7 = uVar1, bVar10 == 10)) {
        line_num = line_num + 1;
      }
      std::__cxx11::string::push_back((char)&local_390);
      local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_250,local_390._M_dataplus._M_p,
                 local_390._M_dataplus._M_p + local_390._M_string_length);
      Word::Word((Word *)local_3c8,AND,&local_250,line_num);
      std::vector<front::word::Word,_std::allocator<front::word::Word>_>::
      emplace_back<front::word::Word>(local_398,(Word *)local_3c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c8._8_8_ != &local_3b0) {
        operator_delete((void *)local_3c8._8_8_,local_3b0._0_8_ + 1);
      }
      uVar8 = local_250.field_2._M_allocated_capacity;
      _Var9._M_p = local_250._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != &local_250.field_2) goto LAB_001b0cd7;
      break;
    case 0x28:
      std::__cxx11::string::push_back((char)&local_390);
      local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2d0,local_390._M_dataplus._M_p,
                 local_390._M_dataplus._M_p + local_390._M_string_length);
      Word::Word((Word *)local_3c8,LPARENT,&local_2d0,line_num);
      std::vector<front::word::Word,_std::allocator<front::word::Word>_>::
      emplace_back<front::word::Word>(local_398,(Word *)local_3c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c8._8_8_ != &local_3b0) {
        operator_delete((void *)local_3c8._8_8_,local_3b0._0_8_ + 1);
      }
      uVar8 = local_2d0.field_2._M_allocated_capacity;
      _Var9._M_p = local_2d0._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) goto LAB_001b0cd7;
      break;
    case 0x29:
      std::__cxx11::string::push_back((char)&local_390);
      local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2f0,local_390._M_dataplus._M_p,
                 local_390._M_dataplus._M_p + local_390._M_string_length);
      Word::Word((Word *)local_3c8,RPARENT,&local_2f0,line_num);
      std::vector<front::word::Word,_std::allocator<front::word::Word>_>::
      emplace_back<front::word::Word>(local_398,(Word *)local_3c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c8._8_8_ != &local_3b0) {
        operator_delete((void *)local_3c8._8_8_,local_3b0._0_8_ + 1);
      }
      uVar8 = local_2f0.field_2._M_allocated_capacity;
      _Var9._M_p = local_2f0._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) goto LAB_001b0cd7;
      break;
    case 0x2a:
      std::__cxx11::string::push_back((char)&local_390);
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f0,local_390._M_dataplus._M_p,
                 local_390._M_dataplus._M_p + local_390._M_string_length);
      Word::Word((Word *)local_3c8,MULT,&local_f0,line_num);
      std::vector<front::word::Word,_std::allocator<front::word::Word>_>::
      emplace_back<front::word::Word>(local_398,(Word *)local_3c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c8._8_8_ != &local_3b0) {
        operator_delete((void *)local_3c8._8_8_,local_3b0._0_8_ + 1);
      }
      uVar8 = local_f0.field_2._M_allocated_capacity;
      _Var9._M_p = local_f0._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) goto LAB_001b0cd7;
      break;
    case 0x2b:
      std::__cxx11::string::push_back((char)&local_390);
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b0,local_390._M_dataplus._M_p,
                 local_390._M_dataplus._M_p + local_390._M_string_length);
      Word::Word((Word *)local_3c8,PLUS,&local_b0,line_num);
      std::vector<front::word::Word,_std::allocator<front::word::Word>_>::
      emplace_back<front::word::Word>(local_398,(Word *)local_3c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c8._8_8_ != &local_3b0) {
        operator_delete((void *)local_3c8._8_8_,local_3b0._0_8_ + 1);
      }
      uVar8 = local_b0.field_2._M_allocated_capacity;
      _Var9._M_p = local_b0._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) goto LAB_001b0cd7;
      break;
    case 0x2c:
      std::__cxx11::string::push_back((char)&local_390);
      local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2b0,local_390._M_dataplus._M_p,
                 local_390._M_dataplus._M_p + local_390._M_string_length);
      Word::Word((Word *)local_3c8,COMMA,&local_2b0,line_num);
      std::vector<front::word::Word,_std::allocator<front::word::Word>_>::
      emplace_back<front::word::Word>(local_398,(Word *)local_3c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c8._8_8_ != &local_3b0) {
        operator_delete((void *)local_3c8._8_8_,local_3b0._0_8_ + 1);
      }
      uVar8 = local_2b0.field_2._M_allocated_capacity;
      _Var9._M_p = local_2b0._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) goto LAB_001b0cd7;
      break;
    case 0x2d:
      std::__cxx11::string::push_back((char)&local_390);
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d0,local_390._M_dataplus._M_p,
                 local_390._M_dataplus._M_p + local_390._M_string_length);
      Word::Word((Word *)local_3c8,MINU,&local_d0,line_num);
      std::vector<front::word::Word,_std::allocator<front::word::Word>_>::
      emplace_back<front::word::Word>(local_398,(Word *)local_3c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c8._8_8_ != &local_3b0) {
        operator_delete((void *)local_3c8._8_8_,local_3b0._0_8_ + 1);
      }
      uVar8 = local_d0.field_2._M_allocated_capacity;
      _Var9._M_p = local_d0._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) goto LAB_001b0cd7;
      break;
    case 0x2f:
      std::__cxx11::string::push_back((char)&local_390);
      uVar1 = uVar7 + 1;
      uVar5 = input_str->_M_string_length;
      if ((uVar1 < uVar5) &&
         (bVar10 = (input_str->_M_dataplus)._M_p[uVar1], uVar7 = uVar1, bVar10 == 10)) {
        line_num = line_num + 1;
      }
      if (bVar10 == 10) {
        line_num = line_num - 1;
LAB_001b0fa9:
        bVar10 = (input_str->_M_dataplus)._M_p[uVar7 - 1];
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_110,local_390._M_dataplus._M_p,
                   local_390._M_dataplus._M_p + local_390._M_string_length);
        Word::Word((Word *)local_3c8,DIV,&local_110,line_num);
        std::vector<front::word::Word,_std::allocator<front::word::Word>_>::
        emplace_back<front::word::Word>(local_398,(Word *)local_3c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3c8._8_8_ != &local_3b0) {
          operator_delete((void *)local_3c8._8_8_,local_3b0._0_8_ + 1);
        }
        uVar8 = local_110.field_2._M_allocated_capacity;
        _Var9._M_p = local_110._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) goto LAB_001b004f;
        goto LAB_001b0057;
      }
      if (bVar10 == 0x2f) {
        uVar3 = line_num;
        do {
          uVar1 = uVar7 + 1;
          if ((uVar1 < uVar5) &&
             (bVar10 = (input_str->_M_dataplus)._M_p[uVar1], uVar7 = uVar1, bVar10 == 10)) {
            uVar3 = uVar3 + 1;
            line_num = uVar3;
          }
        } while (bVar10 != 10);
      }
      else {
        if (bVar10 != 0x2a) goto LAB_001b0fa9;
        cVar11 = '\0';
        uVar3 = line_num;
        do {
          uVar1 = uVar7 + 1;
          if ((uVar1 < uVar5) &&
             (bVar10 = (input_str->_M_dataplus)._M_p[uVar1], uVar7 = uVar1, bVar10 == 10)) {
            uVar3 = uVar3 + 1;
            line_num = uVar3;
          }
          if ((cVar11 == '\x01') || (cVar11 == '\0' && bVar10 == 0x2a)) {
            cVar11 = bVar10 == 0x2a;
            bVar12 = bVar10 != 0x2f;
            if (!bVar12) {
              cVar11 = '\x02';
            }
          }
          else {
            cVar11 = '\0';
            bVar12 = true;
          }
        } while (bVar12);
      }
      break;
    case 0x3b:
      std::__cxx11::string::push_back((char)&local_390);
      local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_290,local_390._M_dataplus._M_p,
                 local_390._M_dataplus._M_p + local_390._M_string_length);
      Word::Word((Word *)local_3c8,SEMICN,&local_290,line_num);
      std::vector<front::word::Word,_std::allocator<front::word::Word>_>::
      emplace_back<front::word::Word>(local_398,(Word *)local_3c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c8._8_8_ != &local_3b0) {
        operator_delete((void *)local_3c8._8_8_,local_3b0._0_8_ + 1);
      }
      uVar8 = local_290.field_2._M_allocated_capacity;
      _Var9._M_p = local_290._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != &local_290.field_2) goto LAB_001b0cd7;
      break;
    case 0x3c:
      std::__cxx11::string::push_back((char)&local_390);
      uVar1 = uVar7 + 1;
      if ((uVar1 < input_str->_M_string_length) &&
         (bVar10 = (input_str->_M_dataplus)._M_p[uVar1], uVar7 = uVar1, bVar10 == 10)) {
        line_num = line_num + 1;
      }
      if (bVar10 == 10) {
        line_num = line_num - 1;
      }
      else if (bVar10 == 0x3d) {
        std::__cxx11::string::push_back((char)&local_390);
        local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_150,local_390._M_dataplus._M_p,
                   local_390._M_dataplus._M_p + local_390._M_string_length);
        Word::Word((Word *)local_3c8,LEQ,&local_150,line_num);
        std::vector<front::word::Word,_std::allocator<front::word::Word>_>::
        emplace_back<front::word::Word>(local_398,(Word *)local_3c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3c8._8_8_ != &local_3b0) {
          operator_delete((void *)local_3c8._8_8_,local_3b0._0_8_ + 1);
        }
        uVar8 = local_150.field_2._M_allocated_capacity;
        _Var9._M_p = local_150._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_dataplus._M_p != &local_150.field_2) goto LAB_001b0cd7;
        break;
      }
      bVar10 = (input_str->_M_dataplus)._M_p[uVar7 - 1];
      local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_170,local_390._M_dataplus._M_p,
                 local_390._M_dataplus._M_p + local_390._M_string_length);
      Word::Word((Word *)local_3c8,LSS,&local_170,line_num);
      std::vector<front::word::Word,_std::allocator<front::word::Word>_>::
      emplace_back<front::word::Word>(local_398,(Word *)local_3c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c8._8_8_ != &local_3b0) {
        operator_delete((void *)local_3c8._8_8_,local_3b0._0_8_ + 1);
      }
      uVar8 = local_170.field_2._M_allocated_capacity;
      _Var9._M_p = local_170._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p != &local_170.field_2) goto LAB_001b004f;
      goto LAB_001b0057;
    case 0x3d:
      std::__cxx11::string::push_back((char)&local_390);
      uVar1 = uVar7 + 1;
      if ((uVar1 < input_str->_M_string_length) &&
         (bVar10 = (input_str->_M_dataplus)._M_p[uVar1], uVar7 = uVar1, bVar10 == 10)) {
        line_num = line_num + 1;
      }
      if (bVar10 == 10) {
        line_num = line_num - 1;
      }
      else if (bVar10 == 0x3d) {
        std::__cxx11::string::push_back((char)&local_390);
        local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1d0,local_390._M_dataplus._M_p,
                   local_390._M_dataplus._M_p + local_390._M_string_length);
        Word::Word((Word *)local_3c8,EQL,&local_1d0,line_num);
        std::vector<front::word::Word,_std::allocator<front::word::Word>_>::
        emplace_back<front::word::Word>(local_398,(Word *)local_3c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3c8._8_8_ != &local_3b0) {
          operator_delete((void *)local_3c8._8_8_,local_3b0._0_8_ + 1);
        }
        uVar8 = local_1d0.field_2._M_allocated_capacity;
        _Var9._M_p = local_1d0._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) goto LAB_001b0cd7;
        break;
      }
      bVar10 = (input_str->_M_dataplus)._M_p[uVar7 - 1];
      local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1f0,local_390._M_dataplus._M_p,
                 local_390._M_dataplus._M_p + local_390._M_string_length);
      Word::Word((Word *)local_3c8,ASSIGN,&local_1f0,line_num);
      std::vector<front::word::Word,_std::allocator<front::word::Word>_>::
      emplace_back<front::word::Word>(local_398,(Word *)local_3c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c8._8_8_ != &local_3b0) {
        operator_delete((void *)local_3c8._8_8_,local_3b0._0_8_ + 1);
      }
      uVar8 = local_1f0.field_2._M_allocated_capacity;
      _Var9._M_p = local_1f0._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) goto LAB_001b004f;
      goto LAB_001b0057;
    case 0x3e:
      std::__cxx11::string::push_back((char)&local_390);
      uVar1 = uVar7 + 1;
      if ((uVar1 < input_str->_M_string_length) &&
         (bVar10 = (input_str->_M_dataplus)._M_p[uVar1], uVar7 = uVar1, bVar10 == 10)) {
        line_num = line_num + 1;
      }
      if (bVar10 == 10) {
        line_num = line_num - 1;
      }
      else if (bVar10 == 0x3d) {
        std::__cxx11::string::push_back((char)&local_390);
        local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_190,local_390._M_dataplus._M_p,
                   local_390._M_dataplus._M_p + local_390._M_string_length);
        Word::Word((Word *)local_3c8,GEQ,&local_190,line_num);
        std::vector<front::word::Word,_std::allocator<front::word::Word>_>::
        emplace_back<front::word::Word>(local_398,(Word *)local_3c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3c8._8_8_ != &local_3b0) {
          operator_delete((void *)local_3c8._8_8_,local_3b0._0_8_ + 1);
        }
        uVar8 = local_190.field_2._M_allocated_capacity;
        _Var9._M_p = local_190._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._M_dataplus._M_p != &local_190.field_2) goto LAB_001b0cd7;
        break;
      }
      bVar10 = (input_str->_M_dataplus)._M_p[uVar7 - 1];
      local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1b0,local_390._M_dataplus._M_p,
                 local_390._M_dataplus._M_p + local_390._M_string_length);
      Word::Word((Word *)local_3c8,GRE,&local_1b0,line_num);
      std::vector<front::word::Word,_std::allocator<front::word::Word>_>::
      emplace_back<front::word::Word>(local_398,(Word *)local_3c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c8._8_8_ != &local_3b0) {
        operator_delete((void *)local_3c8._8_8_,local_3b0._0_8_ + 1);
      }
      uVar8 = local_1b0.field_2._M_allocated_capacity;
      _Var9._M_p = local_1b0._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) goto LAB_001b004f;
LAB_001b0057:
      uVar7 = uVar7 - 1;
    }
switchD_001afd99_caseD_23:
  } while (uVar7 != input_str->_M_string_length - 1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != &local_390.field_2) {
    operator_delete(local_390._M_dataplus._M_p,
                    CONCAT71(local_390.field_2._M_allocated_capacity._1_7_,
                             local_390.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void front::word::word_analyse(string &input_str, vector<Word> &word_arr) {
  string buf;
  size_t index = 0;
  char ch = 0;
  input_str = '\0' + input_str;
  while (index < input_str.size()) {
    get_char(ch, index, input_str);
    buf.clear();
    while ((!have_body_char(ch) || is_illegel_char(ch)) &&
           index + 1 < input_str.size()) {
      get_char(ch, index, input_str);
    }

    if (is_nodigit(ch)) {
      do {
        buf += ch;
        get_char(ch, index, input_str);
      } while (is_nodigit(ch) || isdigit(ch));
      retract(ch, index, input_str);
      word_arr.push_back(Word(get_token(buf), buf, line_num));
    } else if (isdigit(ch)) {
      if (ch != '0') {
        do {
          buf += ch;
          get_char(ch, index, input_str);
        } while (isdigit(ch));
        retract(ch, index, input_str);
      } else {
        buf += toupper(ch);
        get_char(ch, index, input_str);
        if (ch == 'x' || ch == 'X') {
          buf += toupper(ch);
          get_char(ch, index, input_str);
          do {
            buf += toupper(ch);
            get_char(ch, index, input_str);
          } while (hex_digit(ch));
          retract(ch, index, input_str);
        } else if (octal_digit(ch)) {
          do {
            buf += ch;
            get_char(ch, index, input_str);
          } while (isdigit(ch));
          retract(ch, index, input_str);

        } else {
          retract(ch, index, input_str);
        }
      }
      word_arr.push_back(Word(Token::INTCON, buf, line_num));
    } else if (ch == '\"') {
      get_char(ch, index, input_str);
      while (ch != '\"') {
        buf += ch;
        get_char(ch, index, input_str);
      }
      word_arr.push_back(Word(Token::STRCON, buf, line_num));
    } else if (ch == '+') {
      buf += ch;
      word_arr.push_back(Word(Token::PLUS, buf, line_num));
    } else if (ch == '-') {
      buf += ch;
      word_arr.push_back(Word(Token::MINU, buf, line_num));
    } else if (ch == '*') {
      buf += ch;
      word_arr.push_back(Word(Token::MULT, buf, line_num));
    } else if (ch == '/') {
      buf += ch;
      get_char(ch, index, input_str);
      if (ch == '/') {
        do {
          get_char(ch, index, input_str);
        } while (ch != '\n');
      } else if (ch == '*') {
        int stt = 0;
        do {
          get_char(ch, index, input_str);
          if (stt == 0) {
            if (ch == '*') {
              stt = 1;
            }
          }
          if (stt == 1) {
            if (ch == '/') {
              stt = 2;
            } else if (ch == '*') {
              stt = 1;
            } else {
              stt = 0;
            }
          }
        } while (stt < 2);
      } else {
        retract(ch, index, input_str);
        word_arr.push_back(Word(Token::DIV, buf, line_num));
      }
    } else if (ch == '%') {
      buf += ch;
      word_arr.push_back(Word(Token::MOD, buf, line_num));
    } else if (ch == '<') {
      buf += ch;
      get_char(ch, index, input_str);
      if (ch == '=') {
        buf += ch;
        word_arr.push_back(Word(Token::LEQ, buf, line_num));
      } else {
        retract(ch, index, input_str);
        word_arr.push_back(Word(Token::LSS, buf, line_num));
      }
    } else if (ch == '>') {
      buf += ch;
      get_char(ch, index, input_str);
      if (ch == '=') {
        buf += ch;
        word_arr.push_back(Word(Token::GEQ, buf, line_num));
      } else {
        retract(ch, index, input_str);
        word_arr.push_back(Word(Token::GRE, buf, line_num));
      }
    } else if (ch == '=') {
      buf += ch;
      get_char(ch, index, input_str);
      if (ch == '=') {
        buf += ch;
        word_arr.push_back(Word(Token::EQL, buf, line_num));
      } else {
        retract(ch, index, input_str);
        word_arr.push_back(Word(Token::ASSIGN, buf, line_num));
      }
    } else if (ch == '!') {
      buf += ch;
      get_char(ch, index, input_str);
      if (ch == '=') {
        buf += ch;
        word_arr.push_back(Word(Token::NEQ, buf, line_num));
      } else {
        retract(ch, index, input_str);
        word_arr.push_back(Word(Token::NOT, buf, line_num));
      }

    } else if (ch == '&') {
      buf += ch;
      get_char(ch, index, input_str);
      buf += ch;
      word_arr.push_back(Word(Token::AND, buf, line_num));
    } else if (ch == '|') {
      buf += ch;
      get_char(ch, index, input_str);
      buf += ch;
      word_arr.push_back(Word(Token::OR, buf, line_num));
    } else if (ch == ';') {
      buf += ch;
      word_arr.push_back(Word(Token::SEMICN, buf, line_num));
    } else if (ch == ',') {
      buf += ch;
      word_arr.push_back(Word(Token::COMMA, buf, line_num));
    } else if (ch == '(') {
      buf += ch;
      word_arr.push_back(Word(Token::LPARENT, buf, line_num));
    } else if (ch == ')') {
      buf += ch;
      word_arr.push_back(Word(Token::RPARENT, buf, line_num));
    } else if (ch == '[') {
      buf += ch;
      word_arr.push_back(Word(Token::LBRACK, buf, line_num));
    } else if (ch == ']') {
      buf += ch;
      word_arr.push_back(Word(Token::RBRACK, buf, line_num));
    } else if (ch == '{') {
      buf += ch;
      word_arr.push_back(Word(Token::LBRACE, buf, line_num));
    } else if (ch == '}') {
      buf += ch;
      word_arr.push_back(Word(Token::RBRACE, buf, line_num));
    }

    if (index == input_str.size() - 1) {
      break;
    }
  }
}